

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O0

DockWidgetArea QDockWidgetPrivate::toDockWidgetArea(DockPosition pos)

{
  DockPosition pos_local;
  DockWidgetArea local_4;
  
  switch(pos) {
  case LeftDock:
    local_4 = LeftDockWidgetArea;
    break;
  case RightDock:
    local_4 = RightDockWidgetArea;
    break;
  case TopDock:
    local_4 = TopDockWidgetArea;
    break;
  case BottomDock:
    local_4 = BottomDockWidgetArea;
    break;
  default:
    local_4 = NoDockWidgetArea;
  }
  return local_4;
}

Assistant:

Qt::DockWidgetArea QDockWidgetPrivate::toDockWidgetArea(QInternal::DockPosition pos)
{
    switch (pos) {
    case QInternal::LeftDock:   return Qt::LeftDockWidgetArea;
    case QInternal::RightDock:  return Qt::RightDockWidgetArea;
    case QInternal::TopDock:    return Qt::TopDockWidgetArea;
    case QInternal::BottomDock: return Qt::BottomDockWidgetArea;
    default: break;
    }
    return Qt::NoDockWidgetArea;
}